

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O3

void __thiscall
QMakeSourceFileInfo::dependTreeWalker
          (QMakeSourceFileInfo *this,SourceFile *node,SourceDependChildren *place)

{
  SourceDependChildren *pSVar1;
  long lVar2;
  
  if ((node->field_0x3c & 6) == 4) {
    SourceDependChildren::addChild(place,node);
    node->field_0x3c = node->field_0x3c | 2;
    pSVar1 = node->deps;
    if ((pSVar1 != (SourceDependChildren *)0x0) && (0 < pSVar1->used_nodes)) {
      lVar2 = 0;
      do {
        dependTreeWalker(this,pSVar1->children[lVar2],place);
        lVar2 = lVar2 + 1;
        pSVar1 = node->deps;
      } while (lVar2 < pSVar1->used_nodes);
    }
  }
  return;
}

Assistant:

void QMakeSourceFileInfo::dependTreeWalker(SourceFile *node, SourceDependChildren *place)
{
    if(node->traversed || !node->exists)
        return;
    place->addChild(node);
    node->traversed = true; //set flag
    if(node->deps) {
        for(int i = 0; i < node->deps->used_nodes; i++)
            dependTreeWalker(node->deps->children[i], place);
    }
}